

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O2

int countzerobits(bitmap bmp,int from,int to)

{
  int z;
  
  z = 0;
  for (; from < to; from = from + 1) {
    z = z + (uint)(-1 < (char)(bmp[from >> 3] << (from & 7U)));
  }
  return z;
}

Assistant:

int countzerobits(bitmap bmp, int from, int to){
  int z=0;
  for(int j=from;j<to;j++){
    if(!getbit(j,bmp)){
      z++;
    }
  }
  return z;
}